

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O3

void __thiscall
chrono::utils::Generator::CreateObjectsCylinderX
          (Generator *this,Sampler<double> *sampler,ChVector<double> *pos,float radius,
          float halfHeight,ChVector<double> *vel)

{
  int iVar1;
  float fVar2;
  undefined4 in_XMM0_Db;
  double dVar3;
  PointVector points;
  PointVector local_38;
  
  fVar2 = radius;
  normalizeMixture(this);
  (*sampler->_vptr_Sampler[2])(sampler);
  iVar1 = (*(this->m_system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                    ();
  if (iVar1 == 1) {
    dVar3 = calcMinSeparation(this,(double)CONCAT44(in_XMM0_Db,fVar2));
  }
  else {
    dVar3 = (double)CONCAT44(in_XMM0_Db,fVar2);
  }
  (*sampler->_vptr_Sampler[3])(dVar3,sampler);
  if (&sampler->m_center != pos) {
    (sampler->m_center).m_data[0] = pos->m_data[0];
    (sampler->m_center).m_data[1] = pos->m_data[1];
    (sampler->m_center).m_data[2] = pos->m_data[2];
  }
  (sampler->m_size).m_data[0] = (double)halfHeight;
  (sampler->m_size).m_data[1] = (double)radius;
  (sampler->m_size).m_data[2] = (double)radius;
  (*sampler->_vptr_Sampler[4])(&local_38,sampler,2);
  createObjects(this,&local_38,vel);
  if (local_38.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Generator::CreateObjectsCylinderX(Sampler<double>& sampler,
                                       const ChVector<>& pos,
                                       float radius,
                                       float halfHeight,
                                       const ChVector<>& vel) {
    // Normalize the mixture ratios
    normalizeMixture();

    // Generate the object locations
    double sep = sampler.GetSeparation();
    if (m_system->GetContactMethod() == ChContactMethod::SMC)
        sep = calcMinSeparation(sep);
    sampler.SetSeparation(sep);

    PointVector points = sampler.SampleCylinderX(pos, radius, halfHeight);
    createObjects(points, vel);
}